

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzer.cpp
# Opt level: O3

void __thiscall MidiAnalyzer::WorkerThread(MidiAnalyzer *this)

{
  MidiAnalyzerResults *pMVar1;
  byte bVar2;
  U32 UVar3;
  int iVar4;
  MarkerType MVar5;
  int iVar6;
  MidiFrameType MVar7;
  AnalyzerChannelData *pAVar8;
  MidiAnalyzer *this_00;
  byte bVar9;
  byte mData;
  MidiFrameType FrameType;
  stash stash1;
  Frame frame;
  MidiFrameType local_74;
  stash local_70;
  undefined8 local_68;
  undefined8 local_60;
  ulong local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined1 local_47;
  long local_40;
  undefined8 local_38;
  
  UVar3 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar3;
  pAVar8 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSerial = pAVar8;
  iVar4 = AnalyzerChannelData::GetBitState();
  if (iVar4 == 0) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  local_40 = (long)(((double)this->mSampleRateHz * 1.5) /
                   (double)((this->mSettings)._M_ptr)->mBitRate);
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    local_38 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::Advance((uint)this->mSerial);
    bVar9 = 1;
    iVar4 = 8;
    mData = 0;
    do {
      pMVar1 = (this->mResults)._M_ptr;
      MVar5 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddMarker((ulonglong)pMVar1,MVar5,(Channel *)0x0);
      iVar6 = AnalyzerChannelData::GetBitState();
      bVar2 = 0;
      if (iVar6 == 1) {
        bVar2 = bVar9;
      }
      mData = mData | bVar2;
      this_00 = (MidiAnalyzer *)this->mSerial;
      AnalyzerChannelData::Advance((uint)this_00);
      bVar9 = bVar9 * '\x02';
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    local_74 = error;
    local_70.channel = 0xf8;
    if ((char)mData < '\0') {
      if (mData < 0xf0) {
        local_70.channel = mData & 0xf;
        this->dataFrameCorrespondingChannel = (uint)(byte)local_70.channel;
        switch(mData) {
        default:
          local_74 = NoteOff;
          MVar7 = NoteOff;
          break;
        case 0x90:
        case 0x91:
        case 0x92:
        case 0x93:
        case 0x94:
        case 0x95:
        case 0x96:
        case 0x97:
        case 0x98:
        case 0x99:
        case 0x9a:
        case 0x9b:
        case 0x9c:
        case 0x9d:
        case 0x9e:
        case 0x9f:
          local_74 = NoteOn;
          MVar7 = NoteOn;
          break;
        case 0xa0:
        case 0xa1:
        case 0xa2:
        case 0xa3:
        case 0xa4:
        case 0xa5:
        case 0xa6:
        case 0xa7:
        case 0xa8:
        case 0xa9:
        case 0xaa:
        case 0xab:
        case 0xac:
        case 0xad:
        case 0xae:
        case 0xaf:
          local_74 = Aftertouch;
          MVar7 = Aftertouch;
          break;
        case 0xb0:
        case 0xb1:
        case 0xb2:
        case 0xb3:
        case 0xb4:
        case 0xb5:
        case 0xb6:
        case 0xb7:
        case 0xb8:
        case 0xb9:
        case 0xba:
        case 0xbb:
        case 0xbc:
        case 0xbd:
        case 0xbe:
        case 0xbf:
          local_74 = ContinuousController;
          MVar7 = ContinuousController;
          break;
        case 0xc0:
        case 0xc1:
        case 0xc2:
        case 0xc3:
        case 0xc4:
        case 0xc5:
        case 0xc6:
        case 199:
        case 200:
        case 0xc9:
        case 0xca:
        case 0xcb:
        case 0xcc:
        case 0xcd:
        case 0xce:
        case 0xcf:
          local_74 = PatchChange;
          MVar7 = PatchChange;
          break;
        case 0xd0:
        case 0xd1:
        case 0xd2:
        case 0xd3:
        case 0xd4:
        case 0xd5:
        case 0xd6:
        case 0xd7:
        case 0xd8:
        case 0xd9:
        case 0xda:
        case 0xdb:
        case 0xdc:
        case 0xdd:
        case 0xde:
        case 0xdf:
          local_74 = ChannelPressure;
          MVar7 = ChannelPressure;
          break;
        case 0xe0:
        case 0xe1:
        case 0xe2:
        case 0xe3:
        case 0xe4:
        case 0xe5:
        case 0xe6:
        case 0xe7:
        case 0xe8:
        case 0xe9:
        case 0xea:
        case 0xeb:
        case 0xec:
        case 0xed:
        case 0xee:
        case 0xef:
          local_74 = PitchBend;
          MVar7 = PitchBend;
        }
        this->lastCommandPacketType = MVar7;
        this->distanceFromLastCommandPacket = 0;
      }
      else {
        systemMessage(this_00,mData,&local_74,&local_70);
      }
    }
    else {
      dataParameter(this,'\0',&local_74,&local_70);
    }
    Frame::Frame((Frame *)&local_68);
    local_50 = CONCAT71(local_70.mData2._1_7_,local_70.channel);
    local_48 = (undefined1)local_74;
    local_47 = 0;
    local_68 = local_38;
    local_58 = (ulong)mData;
    local_60 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
    AnalyzerResults::CommitResults();
    Analyzer::ReportProgress((ulonglong)this);
    if (this->distanceFromLastCommandPacket != -1) {
      this->distanceFromLastCommandPacket = this->distanceFromLastCommandPacket + 1;
    }
    Frame::~Frame((Frame *)&local_68);
  } while( true );
}

Assistant:

void MidiAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();

    mSerial = GetAnalyzerChannelData( mSettings->mInputChannel );

    if( mSerial->GetBitState() == BIT_LOW )
        mSerial->AdvanceToNextEdge();

    // double Stop_Bits = mSettings->mStopBits;
    unsigned short DataBits = 8; // FIXME
    bool BigEndian = false;      // FIXME
    /*
     * Big endian / Little endian.
     * 31.25 kBaud, 1 start, 8 data, 1 stop bit.
     * Asynchronous
     */

    U32 samples_per_bit = mSampleRateHz / mSettings->mBitRate;
    U32 samples_to_first_center_of_first_data_bit = U32( 1.5 * double( mSampleRateHz ) / double( mSettings->mBitRate ) );
    // U8 dataQueue[5];				// Storage for previous frames, arranged in a FIFO.
    // memset( &dataQueue, 0, sizeof(dataQueue) );	// clear it.

    for( ;; )
    {
        U8 data = 0;
        U8 mask = 0;

        if( BigEndian )
            mask = 1 << 7;
        else
            mask = 1;

        enum MidiFrameType FrameType;
        union stash stash1;

        mSerial->AdvanceToNextEdge(); // falling edge -- beginning of the start bit
        U64 starting_sample = mSerial->GetSampleNumber();
        mSerial->Advance( samples_to_first_center_of_first_data_bit );

        for( U32 i = 0; i < DataBits; i++ )
        { // Read in data.
            // let's put a dot exactly where we sample this bit:
            mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::Dot, mSettings->mInputChannel );
            if( mSerial->GetBitState() == BIT_HIGH )
            {
                data |= mask;
            }
            mSerial->Advance( samples_per_bit );

            if( BigEndian )
                mask = mask >> 1;
            else
                mask = mask << 1;
        }

        // Set defaults, debugging aid.
        FrameType = error;
        stash1.channel = -8;

        // Determine if data is a DATA byte or a COMMAND byte.
        if( data >= 0x80 )
        { // COMMAND byte.  Data has the MSB clear, Command bytes have it set.
            if( ( data & 0xF0 ) == 0xF0 )
            { // All system messages have 0xF in the high nibble.
                systemMessage( data, &FrameType, &stash1 );
            }
            else
            {
                channelMessage( data, &FrameType, &stash1 );
                distanceFromLastCommandPacket = 0;
            }
        }
        else
        { // DATA byte
            dataParameter( data, &FrameType, &stash1 );
        }

        // we have a byte to save.
        Frame frame;
        frame.mData1 = data;
        frame.mData2 = stash1.mData2;
        frame.mType = FrameType;
        frame.mFlags = 0;
        frame.mStartingSampleInclusive = starting_sample;
        frame.mEndingSampleInclusive = mSerial->GetSampleNumber();

        mResults->AddFrame( frame );
        mResults->CommitResults();
        ReportProgress( frame.mEndingSampleInclusive );

        if( distanceFromLastCommandPacket != -1 )
        {
            distanceFromLastCommandPacket++;
        }
    }
}